

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

Vec_Int_t * Acb_ObjMarkTfo(Acb_Ntk_t *p,Vec_Int_t *vDivs,int Pivot,int nTfoLevMax,int nFanMax)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  long lVar4;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(4000);
  p_00->pArray = piVar3;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar3 = (p->vObjTrav).pArray;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  iVar2 = p->nObjTravs + 1;
  p->nObjTravs = iVar2;
  if ((-1 < Pivot) && (Pivot < (p->vObjTrav).nSize)) {
    (p->vObjTrav).pArray[(uint)Pivot] = iVar2;
    Vec_IntPush(p_00,Pivot);
    if (0 < vDivs->nSize) {
      lVar4 = 0;
      do {
        Acb_ObjMarkTfo_rec(p,vDivs->pArray[lVar4],nTfoLevMax,nFanMax,p_00);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vDivs->nSize);
    }
    return p_00;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Acb_ObjMarkTfo( Acb_Ntk_t * p, Vec_Int_t * vDivs, int Pivot, int nTfoLevMax, int nFanMax )
{
    Vec_Int_t * vMarked = Vec_IntAlloc( 1000 );
    int i, iObj;
    Acb_NtkIncTravId( p );
    Acb_ObjSetTravIdCur( p, Pivot );
    Vec_IntPush( vMarked, Pivot );
    Vec_IntForEachEntry( vDivs, iObj, i )
        Acb_ObjMarkTfo_rec( p, iObj, nTfoLevMax, nFanMax, vMarked );
    return vMarked;
}